

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_scanline_aa.h
# Opt level: O2

void __thiscall
agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::clip_box
          (rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_> *this,double x1,
          double y1,double x2,double y2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  reset(this);
  uVar1 = -(ulong)(x1 * 256.0 < 0.0);
  uVar2 = -(ulong)(y1 * 256.0 < 0.0);
  uVar3 = -(ulong)(x2 * 256.0 < 0.0);
  uVar4 = -(ulong)(y2 * 256.0 < 0.0);
  rasterizer_sl_clip<agg::ras_conv_int>::clip_box
            (&this->m_clipper,
             (int)((double)(~uVar1 & 0x3fe0000000000000 | uVar1 & 0xbfe0000000000000) + x1 * 256.0),
             (int)((double)(~uVar2 & 0x3fe0000000000000 | uVar2 & 0xbfe0000000000000) + y1 * 256.0),
             (int)((double)(~uVar3 & 0x3fe0000000000000 | uVar3 & 0xbfe0000000000000) + x2 * 256.0),
             (int)((double)(~uVar4 & 0x3fe0000000000000 | uVar4 & 0xbfe0000000000000) + y2 * 256.0))
  ;
  return;
}

Assistant:

void rasterizer_scanline_aa<Clip>::clip_box(double x1, double y1, 
                                                double x2, double y2)
    {
        reset();
        m_clipper.clip_box(conv_type::upscale(x1), conv_type::upscale(y1), 
                           conv_type::upscale(x2), conv_type::upscale(y2));
    }